

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O3

int __thiscall
CCollision::IntersectLine
          (CCollision *this,vec2 Pos0,vec2 Pos1,vec2 *pOutCollision,vec2 *pOutBeforeCollision)

{
  vec2 vVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar5;
  float fVar6;
  anon_union_4_2_94730284_for_vector2_base<float>_1 x;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar7;
  float fVar8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 y;
  float fVar9;
  float fVar10;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_58;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_54;
  
  aVar5 = Pos0.field_0;
  aVar7 = Pos0.field_1;
  fVar6 = aVar5.x - Pos1.field_0.x;
  fVar8 = aVar7.y - Pos1.field_1.y;
  fVar6 = SQRT(fVar6 * fVar6 + fVar8 * fVar8) + 1.0;
  iVar3 = (int)fVar6;
  if (iVar3 < 0) {
LAB_001d1cab:
    if (pOutCollision != (vec2 *)0x0) {
      *pOutCollision = Pos1;
    }
    if (pOutBeforeCollision != (vec2 *)0x0) {
      *pOutBeforeCollision = Pos1;
    }
    return 0;
  }
  fVar8 = 1.0 / (float)(int)fVar6;
  fVar9 = Pos1.field_0.x - aVar5.x;
  fVar10 = Pos1.field_1.y - aVar7.y;
  fVar6 = fVar8 * 0.0;
  x.x = fVar6 * fVar9 + aVar5.x;
  y.y = fVar6 * fVar10 + aVar7.y;
  iVar4 = 1;
  bVar2 = CheckPoint(this,x.x,y.y,1);
  _local_58 = Pos0;
  if (!bVar2) {
    do {
      aStack_54.y = y.y;
      local_58.x = x.x;
      if (iVar4 - iVar3 == 1) goto LAB_001d1cab;
      fVar6 = (float)iVar4 * fVar8;
      x.x = fVar6 * fVar9 + aVar5.x;
      y.y = fVar6 * fVar10 + aVar7.y;
      bVar2 = CheckPoint(this,x.x,y.y,1);
      iVar4 = iVar4 + 1;
    } while (!bVar2);
  }
  if (pOutCollision != (vec2 *)0x0) {
    vVar1.field_1.y = y.y;
    vVar1.field_0.x = x.x;
    *pOutCollision = vVar1;
  }
  if (pOutBeforeCollision != (vec2 *)0x0) {
    *pOutBeforeCollision = _local_58;
  }
  iVar3 = GetCollisionAt(this,x.x,y.y);
  return iVar3;
}

Assistant:

int CCollision::IntersectLine(vec2 Pos0, vec2 Pos1, vec2 *pOutCollision, vec2 *pOutBeforeCollision) const
{
	const int End = distance(Pos0, Pos1)+1;
	const float InverseEnd = 1.0f/End;
	vec2 Last = Pos0;

	for(int i = 0; i <= End; i++)
	{
		vec2 Pos = mix(Pos0, Pos1, i*InverseEnd);
		if(CheckPoint(Pos.x, Pos.y))
		{
			if(pOutCollision)
				*pOutCollision = Pos;
			if(pOutBeforeCollision)
				*pOutBeforeCollision = Last;
			return GetCollisionAt(Pos.x, Pos.y);
		}
		Last = Pos;
	}
	if(pOutCollision)
		*pOutCollision = Pos1;
	if(pOutBeforeCollision)
		*pOutBeforeCollision = Pos1;
	return 0;
}